

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O3

int __thiscall glslang::TPpContext::scanToken(TPpContext *this,TPpToken *ppToken)

{
  pointer *ppTVar1;
  pointer pTVar2;
  iterator __position;
  iterator __position_00;
  byte bVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  pointer piVar7;
  pointer pptVar8;
  pointer piVar9;
  pointer pptVar10;
  bool bVar11;
  int local_2c;
  
  pptVar10 = (this->inputStack).
             super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pptVar8 = (this->inputStack).
            super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  iVar5 = -1;
  if (pptVar10 == pptVar8) {
LAB_00402557:
    local_2c = iVar5;
    if ((pptVar10 != pptVar8) &&
       ((iVar6 = (*pptVar8[-1]->_vptr_tInput[9])(), (char)iVar6 != '\0' &&
        (this->inElseSkip == false)))) {
      if (iVar5 == 10) {
        piVar7 = (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar9 = (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (1 < (int)((ulong)((long)piVar9 - (long)piVar7) >> 2)) {
          bVar3 = 0;
          iVar5 = 0;
          do {
            iVar6 = iVar5 + 1;
            if (piVar7[iVar5] == 0x23) {
              bVar11 = piVar7[iVar6] != 0x23;
              if (!bVar11) {
                iVar6 = iVar5 + 2;
              }
              if ((bool)(bVar11 & bVar3)) {
                (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                          (this->parseContext,
                           (this->lastLineTokenLocs).
                           super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar5,
                           "(#) can be preceded in its line only by spaces or horizontal tabs","#",
                           "");
                piVar7 = (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                piVar9 = (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                bVar3 = 1;
              }
              else {
                bVar3 = bVar3 | bVar11;
              }
            }
            iVar5 = iVar6;
          } while (iVar6 < (int)((ulong)((long)piVar9 - (long)piVar7) >> 2) + -1);
        }
        if (piVar9 != piVar7) {
          (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar7;
        }
        pTVar2 = (this->lastLineTokenLocs).
                 super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((this->lastLineTokenLocs).
            super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>._M_impl.
            super__Vector_impl_data._M_finish != pTVar2) {
          (this->lastLineTokenLocs).
          super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>._M_impl.
          super__Vector_impl_data._M_finish = pTVar2;
        }
      }
      else {
        __position._M_current =
             (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->lastLineTokens,__position,&local_2c);
        }
        else {
          *__position._M_current = iVar5;
          (this->lastLineTokens).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        __position_00._M_current =
             (this->lastLineTokenLocs).
             super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position_00._M_current ==
            (this->lastLineTokenLocs).
            super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<glslang::TSourceLoc,std::allocator<glslang::TSourceLoc>>::
          _M_realloc_insert<glslang::TSourceLoc_const&>
                    ((vector<glslang::TSourceLoc,std::allocator<glslang::TSourceLoc>> *)
                     &this->lastLineTokenLocs,__position_00,&ppToken->loc);
        }
        else {
          uVar4 = *(undefined4 *)&(ppToken->loc).field_0x14;
          (__position_00._M_current)->column = (ppToken->loc).column;
          *(undefined4 *)&(__position_00._M_current)->field_0x14 = uVar4;
          iVar5 = (ppToken->loc).string;
          iVar6 = (ppToken->loc).line;
          (__position_00._M_current)->name = (ppToken->loc).name;
          (__position_00._M_current)->string = iVar5;
          (__position_00._M_current)->line = iVar6;
          ppTVar1 = &(this->lastLineTokenLocs).
                     super__Vector_base<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppTVar1 = *ppTVar1 + 1;
        }
      }
    }
  }
  else {
    do {
      iVar5 = (*pptVar8[-1]->_vptr_tInput[2])();
      pptVar10 = (this->inputStack).
                 super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pptVar8 = (this->inputStack).
                super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((iVar5 != -1) || (iVar5 = -1, pptVar10 == pptVar8)) goto LAB_00402557;
      (*pptVar8[-1]->_vptr_tInput[0xb])();
      pptVar8 = (this->inputStack).
                super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pptVar8[-1] != (tInput *)0x0) {
        (*pptVar8[-1]->_vptr_tInput[1])();
        pptVar8 = (this->inputStack).
                  super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      pptVar8 = pptVar8 + -1;
      (this->inputStack).
      super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = pptVar8;
    } while ((this->inputStack).
             super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
             ._M_impl.super__Vector_impl_data._M_start != pptVar8);
    local_2c = -1;
  }
  return local_2c;
}

Assistant:

int scanToken(TPpToken* ppToken)
    {
        int token = EndOfInput;

        while (! inputStack.empty()) {
            token = inputStack.back()->scan(ppToken);
            if (token != EndOfInput || inputStack.empty())
                break;
            popInput();
        }
        if (!inputStack.empty() && inputStack.back()->isStringInput() && !inElseSkip) {
            if (token == '\n') {
                bool seenNumSign = false;
                for (int i = 0; i < (int)lastLineTokens.size() - 1;) {
                    int curPos = i;
                    int curToken = lastLineTokens[i++];
                    if (curToken == '#' && lastLineTokens[i] == '#') {
                        curToken = PpAtomPaste;
                        i++;
                    }
                    if (curToken == '#') {
                        if (seenNumSign) {
                            parseContext.ppError(lastLineTokenLocs[curPos], "(#) can be preceded in its line only by spaces or horizontal tabs", "#", "");
                        } else {
                            seenNumSign = true;
                        }
                    }
                }
                lastLineTokens.clear();
                lastLineTokenLocs.clear();
            } else {
                lastLineTokens.push_back(token);
                lastLineTokenLocs.push_back(ppToken->loc);
            }
        }
        return token;
    }